

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O1

int Diligent::Parsing::GetArrayIndex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *Start,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *End,
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *NameEnd)

{
  char *pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  void *pvVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos_1;
  char *pcVar5;
  char *pcVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos_2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos;
  int Index;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  int local_2c;
  
  _Var2 = SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(Start,End);
  NameEnd->_M_current = (char *)_Var2;
  if (_Var2._M_current != Start->_M_current) {
    pcVar1 = End->_M_current;
    if (_Var2._M_current == pcVar1) {
      return -1;
    }
    pcVar5 = NameEnd->_M_current;
    local_38._M_current = pcVar5;
    while ((pcVar1 != pcVar5 &&
           (pvVar3 = memchr(" \t",(int)*pcVar5,3), local_38._M_current = pcVar5,
           pvVar3 != (void *)0x0))) {
      pcVar5 = pcVar5 + 1;
      local_38._M_current = pcVar1;
    }
    if (local_38._M_current == pcVar1) {
      return -0x80000000;
    }
    if (*local_38._M_current != '[') {
      return -0x80000000;
    }
    pcVar6 = local_38._M_current + 1;
    pcVar5 = pcVar6;
    while ((pcVar1 != pcVar6 &&
           (pvVar3 = memchr(" \t",(int)*pcVar6,3), pcVar5 = pcVar6, pvVar3 != (void *)0x0))) {
      pcVar6 = pcVar6 + 1;
      pcVar5 = pcVar1;
    }
    if (pcVar5 == pcVar1) {
      return -0x80000000;
    }
    local_2c = -0x80000000;
    local_38._M_current = pcVar5;
    _Var4 = ParseInteger<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int>
                      (&local_38,End,&local_2c);
    pcVar1 = End->_M_current;
    _Var2 = _Var4;
    local_38 = _Var4;
    while ((pcVar1 != _Var4._M_current &&
           (pvVar3 = memchr(" \t",(int)*_Var4._M_current,3), _Var2._M_current = _Var4._M_current,
           pvVar3 != (void *)0x0))) {
      _Var4._M_current = _Var4._M_current + 1;
      _Var2._M_current = pcVar1;
    }
    if (_Var2._M_current != pcVar1) {
      if (*_Var2._M_current != ']') {
        return -0x80000000;
      }
      return local_2c;
    }
  }
  return -0x80000000;
}

Assistant:

inline int GetArrayIndex(const InteratorType& Start, const InteratorType& End, InteratorType& NameEnd)
{
    NameEnd = SkipIdentifier(Start, End);
    // Empty name is not a valid identifier
    if (NameEnd == Start)
    {
        //
        //  ^
        return InvalidArrayIndex;
    }

    if (NameEnd == End)
    {
        // MyArray
        //        ^
        return -1;
    }
    // MyArray [ 16 ]
    //        ^

    auto Pos = SkipDelimiters(NameEnd, End, " \t");
    // MyArray [ 16 ]
    //         ^
    if (Pos == End || *Pos != '[')
        return InvalidArrayIndex;

    Pos = SkipDelimiters(Pos + 1, End, " \t");
    // MyArray [ 16 ]
    //           ^
    if (Pos == End)
        return InvalidArrayIndex;

    int Index = InvalidArrayIndex;
    Pos       = ParseInteger(Pos, End, Index);
    // MyArray [ 16 ]
    //             ^

    Pos = SkipDelimiters(Pos, End, " \t");
    // MyArray [ 16 ]
    //              ^
    return (Pos != End && *Pos == ']') ? Index : InvalidArrayIndex;
}